

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O1

int AF_A_FlyBuzz(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  VM_UBYTE VVar3;
  AActor *other;
  undefined8 *puVar4;
  PClass *pPVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  char *__assertion;
  AActor *pAVar11;
  bool bVar12;
  FSoundID local_4c;
  _func_int **local_48;
  PClass *local_40;
  TAngle<double> local_38;
  DObject *local_30;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b6e57;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    other = (AActor *)(param->field_0).field_1.a;
    if (other != (AActor *)0x0) {
      if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
        (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar10 = (other->super_DThinker).super_DObject.Class;
      bVar12 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar5 && bVar12) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar12 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar5) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar12) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b6e57;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar3 = param[1].field_0.field_3.Type, VVar3 != 0xff)) {
      if ((VVar3 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b6e2c;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar9 = (**(code **)*puVar4)(puVar4);
          puVar4[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar4[1];
        bVar12 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar5 && bVar12) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar12 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar5) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b6e57;
        }
      }
    }
    if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
       ((VVar3 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar11 = (other->target).field_0.p;
      if ((pAVar11 != (AActor *)0x0) &&
         (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (other->target).field_0.p = (AActor *)0x0;
        pAVar11 = (AActor *)0x0;
      }
      if (((pAVar11 == (AActor *)0x0) || (((pAVar11->flags).Value & 0x100000) == 0)) ||
         (uVar7 = FRandom::GenRand32(&pr_fly), (uVar7 & 0xff) < 5)) {
        bVar12 = false;
      }
      else {
        AActor::AngleTo((AActor *)&stack0xffffffffffffffb8,other,SUB81(pAVar11,0));
        (other->Angles).Yaw.Degrees = (double)local_48;
        other->args[0] = other->args[0] + 1;
        dVar1 = (other->__Pos).X;
        dVar2 = (other->__Pos).Y;
        TAngle<double>::ToVector(&stack0xffffffffffffffc8,6.0);
        local_48 = (_func_int **)(dVar1 + local_38.Degrees);
        local_40 = (PClass *)(dVar2 + (double)local_30);
        bVar12 = P_TryMove(other,(DVector2 *)&stack0xffffffffffffffb8,1,(secplane_t *)0x0);
        if (bVar12) {
          if ((other->args[0] & 2) != 0) {
            uVar7 = FRandom::GenRand32(&pr_fly);
            (other->Vel).X = (double)(int)((uVar7 & 0xff) - 0x80) * 0.001953125 + (other->Vel).X;
            uVar7 = FRandom::GenRand32(&pr_fly);
            (other->Vel).Y = (double)(int)((uVar7 & 0xff) - 0x80) * 0.001953125 + (other->Vel).Y;
          }
          uVar8 = FRandom::GenRand32(&pr_fly);
          uVar8 = uVar8 & 0xff;
          uVar7 = -uVar8;
          if ((other->__Pos).Z <= (pAVar11->__Pos).Z + 5.0) {
            uVar7 = uVar8;
          }
          if (uVar8 < 0x97) {
            uVar7 = uVar8;
          }
          (other->Vel).Z = (double)(int)uVar7 * 0.001953125;
          uVar7 = FRandom::GenRand32(&pr_fly);
          if (0x27 < (uVar7 & 0xf8)) {
            return 0;
          }
          local_4c.ID = (other->ActiveSound).super_FSoundID.ID;
          S_Sound(other,2,&local_4c,0.5,3.0);
          return 0;
        }
        bVar12 = true;
      }
      AActor::SetIdle(other,bVar12);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b6e2c:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b6e57:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlyBuzz)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ = self->target;

	if (targ == NULL || !(targ->flags & MF_CORPSE) || pr_fly() < 5)
	{
		self->SetIdle();
		return 0;
	}

	self->Angles.Yaw = self->AngleTo(targ);
	self->args[0]++;
	if (!P_TryMove(self, self->Pos().XY() + self->Angles.Yaw.ToVector(6), true))
	{
		self->SetIdle(true);
		return 0;
	}
	if (self->args[0] & 2)
	{
		self->Vel.X += (pr_fly() - 128) / 512.;
		self->Vel.Y += (pr_fly() - 128) / 512.;
	}
	int zrand = pr_fly();
	if (targ->Z() + 5. < self->Z() && zrand > 150)
	{
		zrand = -zrand;
	}
	self->Vel.Z = zrand / 512.;
	if (pr_fly() < 40)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 0.5f, ATTN_STATIC);
	}
	return 0;
}